

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

vector<Transition_*,_std::allocator<Transition_*>_> * __thiscall
State::getTransitionsOnInput
          (vector<Transition_*,_std::allocator<Transition_*>_> *__return_storage_ptr__,State *this,
          char input,string *stack)

{
  pointer ppTVar1;
  __type _Var2;
  pointer ppTVar3;
  Transition *transition;
  Transition *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Transition_*,_std::allocator<Transition_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Transition_*,_std::allocator<Transition_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Transition_*,_std::allocator<Transition_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppTVar1 = (this->transitionsFrom).super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->transitionsFrom).
                 super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1) {
    local_58 = *ppTVar3;
    if (local_58->input == input) {
      std::__cxx11::string::string((string *)&local_50,(string *)&local_58->stackInput);
      _Var2 = std::operator==(&local_50,stack);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var2) {
        std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
                  ((vector<Transition*,std::allocator<Transition*>> *)__return_storage_ptr__,
                   &local_58);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Transition *> State::getTransitionsOnInput(char input, std::string stack) {
    std::vector<Transition *> transitions;
    for (Transition *transition: transitionsFrom) {
        if (transition->getInput() == input && transition->getStackInput() == stack) {
            transitions.emplace_back(transition);
        }
    }
    return transitions;
}